

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

ExprBase *
CreateAutoRefFunctionSet(ExpressionContext *ctx,SynBase *source,ExprBase *value,InplaceStr name)

{
  FunctionData *pFVar1;
  TypeBase *pTVar2;
  long lVar3;
  TypeFunction *pTVar4;
  SynBase *pSVar5;
  SynBase *pSVar6;
  uint uVar7;
  int iVar8;
  undefined4 extraout_var;
  TypeFunctionSet *pTVar10;
  ExprBase *pEVar11;
  ulong uVar12;
  ulong uVar13;
  ArrayView<TypeBase_*> setTypes;
  IntrusiveList<FunctionHandle> functions;
  SmallArray<TypeBase_*,_16U> types;
  IntrusiveList<FunctionHandle> local_e8;
  SynBase *local_d8;
  SynBase *local_d0;
  SmallArray<TypeBase_*,_16U> local_c8;
  FunctionHandle *pFVar9;
  undefined4 extraout_var_00;
  
  local_c8.allocator = ctx->allocator;
  local_c8.data = local_c8.little;
  local_c8.count = 0;
  local_c8.max = 0x10;
  local_e8.head = (FunctionHandle *)0x0;
  local_e8.tail = (FunctionHandle *)0x0;
  if ((ctx->functions).count != 0) {
    uVar13 = 0;
    local_d8 = (SynBase *)value;
    local_d0 = source;
    do {
      pFVar1 = (ctx->functions).data[uVar13];
      pTVar2 = pFVar1->scope->ownerType;
      if (pTVar2 != (TypeBase *)0x0) {
        uVar7 = NULLC::StringHashContinue(pTVar2->nameHash,"::");
        uVar7 = NULLC::StringHashContinue(uVar7,name.begin,name.end);
        if (((pFVar1->nameHash == uVar7) && ((pFVar1->generics).head == (MatchData *)0x0)) &&
           ((pTVar2 = pFVar1->scope->ownerType, pTVar2->isGeneric != true ||
            ((pTVar2->typeID != 0x16 ||
             (lVar3._0_4_ = pTVar2[2].typeID, lVar3._4_4_ = pTVar2[2].nameHash, lVar3 != 0)))))) {
          pTVar4 = pFVar1->type;
          pFVar9 = local_e8.head;
          if (local_e8.head != (FunctionHandle *)0x0 && (pTVar4->super_TypeBase).isGeneric == false)
          {
            do {
              if (pFVar9->function->type == pTVar4) goto LAB_0015aad7;
              pFVar9 = pFVar9->next;
            } while (pFVar9 != (FunctionHandle *)0x0);
          }
          if (local_c8.count == local_c8.max) {
            SmallArray<TypeBase_*,_16U>::grow(&local_c8,local_c8.count);
          }
          if (local_c8.data == (TypeBase **)0x0) {
            __assert_fail("data",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                          ,0x162,
                          "void SmallArray<TypeBase *, 16>::push_back(const T &) [T = TypeBase *, N = 16]"
                         );
          }
          uVar12 = (ulong)local_c8.count;
          local_c8.count = local_c8.count + 1;
          local_c8.data[uVar12] = &pTVar4->super_TypeBase;
          iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x18);
          pFVar9 = (FunctionHandle *)CONCAT44(extraout_var,iVar8);
          pFVar9->function = pFVar1;
          pFVar9->next = (FunctionHandle *)0x0;
          pFVar9->listed = false;
          IntrusiveList<FunctionHandle>::push_back(&local_e8,pFVar9);
        }
      }
LAB_0015aad7:
      pSVar6 = local_d0;
      pSVar5 = local_d8;
      uVar13 = uVar13 + 1;
    } while (uVar13 < (ctx->functions).count);
    value = (ExprBase *)local_d8;
    source = local_d0;
    if (local_e8.head != (FunctionHandle *)0x0) {
      setTypes.count = local_c8.count;
      setTypes.data = local_c8.data;
      setTypes._12_4_ = 0;
      pTVar10 = ExpressionContext::GetFunctionSetType(ctx,setTypes);
      iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
      pEVar11 = (ExprBase *)CONCAT44(extraout_var_00,iVar8);
      pEVar11->typeID = 0x27;
      pEVar11->source = pSVar6;
      pEVar11->type = &pTVar10->super_TypeBase;
      pEVar11->next = (ExprBase *)0x0;
      pEVar11->listed = false;
      pEVar11->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223e80;
      pEVar11[1]._vptr_ExprBase = (_func_int **)local_e8.head;
      *(FunctionHandle **)&pEVar11[1].typeID = local_e8.tail;
      pEVar11[1].source = pSVar5;
      goto LAB_0015ab66;
    }
  }
  if ((TypeStruct *)((SynBase *)value)->end == ctx->typeAutoRef) {
    anon_unknown.dwarf_9c70f::Stop
              (ctx,source,"ERROR: function \'%.*s\' is undefined in any of existing classes",
               (ulong)(uint)((int)name.end - (int)name.begin),name.begin);
  }
  pEVar11 = (ExprBase *)0x0;
LAB_0015ab66:
  SmallArray<TypeBase_*,_16U>::~SmallArray(&local_c8);
  return pEVar11;
}

Assistant:

ExprBase* CreateAutoRefFunctionSet(ExpressionContext &ctx, SynBase *source, ExprBase *value, InplaceStr name)
{
	SmallArray<TypeBase*, 16> types(ctx.allocator);
	IntrusiveList<FunctionHandle> functions;

	// Find all member functions with the specified name
	for(unsigned i = 0; i < ctx.functions.size(); i++)
	{
		FunctionData *function = ctx.functions[i];

		TypeBase *parentType = function->scope->ownerType;

		if(!parentType)
			continue;

		unsigned hash = NULLC::StringHashContinue(parentType->nameHash, "::");

		hash = NULLC::StringHashContinue(hash, name.begin, name.end);

		if(function->nameHash != hash)
			continue;

		// Can't specify generic function arguments for call through 'auto ref'
		if(!function->generics.empty())
			continue;

		// Ignore generic types if they don't have a single instance
		if(function->scope->ownerType->isGeneric)
		{
			if(TypeGenericClassProto *proto = getType<TypeGenericClassProto>(function->scope->ownerType))
			{
				if(proto->instances.empty())
					continue;
			}
		}

		FunctionHandle *prev = NULL;

		// Pointer to generic types don't stricly match because they might be resolved to different types
		if (!function->type->isGeneric)
		{
			for(FunctionHandle *curr = functions.head; curr; curr = curr->next)
			{
				if(curr->function->type == function->type)
				{
					prev = curr;
					break;
				}
			}
		}

		if(prev)
			continue;

		types.push_back(function->type);
		functions.push_back(new (ctx.get<FunctionHandle>()) FunctionHandle(function));
	}

	if(functions.empty())
	{
		if(value->type != ctx.typeAutoRef)
			return NULL;

		Stop(ctx, source, "ERROR: function '%.*s' is undefined in any of existing classes", FMT_ISTR(name));
	}

	TypeFunctionSet *type = ctx.GetFunctionSetType(types);

	return new (ctx.get<ExprFunctionOverloadSet>()) ExprFunctionOverloadSet(source, type, functions, value);
}